

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall
QtPrivate::QCalendarDateValidator::~QCalendarDateValidator(QCalendarDateValidator *this)

{
  QCalendarDateValidator *in_RDI;
  vector<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_> *unaff_retaddr;
  
  clear(in_RDI);
  QCalendarDayValidator::~QCalendarDayValidator((QCalendarDayValidator *)0x516dea);
  QCalendarMonthValidator::~QCalendarMonthValidator((QCalendarMonthValidator *)0x516df8);
  QCalendarYearValidator::~QCalendarYearValidator((QCalendarYearValidator *)0x516e06);
  std::vector<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>::~vector
            (unaff_retaddr);
  QList<QString>::~QList((QList<QString> *)0x516e1e);
  return;
}

Assistant:

QCalendarDateValidator::~QCalendarDateValidator()
{
    clear();
}